

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O3

void __thiscall Refal2::CScanner::processingBeginOfQualifier(CScanner *this,char c)

{
  if ((c != '_') && (0x19 < (byte)((c & 0xdfU) + 0xbf))) {
    error(this,E_UnexpectedCharacterInQualifier,c);
    this->state = S_Initial;
    processing(this,c);
    return;
  }
  std::__cxx11::string::_M_replace_aux
            ((ulong)&(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                     super_CQualifierParser.token.word,0,
             (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.
             token.word._M_string_length,'\x01');
  this->state = S_Qualifier;
  return;
}

Assistant:

void CScanner::processingBeginOfQualifier( char c )
{
	if( IsFirstWordLetter( c ) ) {
		token.word = c;
		state = S_Qualifier;
	} else {
		error( E_UnexpectedCharacterInQualifier, c );
		state = S_Initial;
		processing( c );
	}
}